

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O3

void large_dalloc_prep_impl(tsdn_t *tsdn,arena_t *arena,edata_t *edata,_Bool locked)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  edata_t *peVar4;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,locked) == 0) {
    if (duckdb_je_manual_arena_base <= arena->ind) {
      __mutex = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48);
      iVar3 = pthread_mutex_trylock(__mutex);
      if (iVar3 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
        (arena->large_mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if ((arena->large_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
        (arena->large_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
        ppwVar2 = &(arena->large_mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      peVar4 = (arena->large).head.qlh_first;
      if (peVar4 == edata) {
        peVar4 = (peVar4->field_5).ql_link_active.qre_next;
        (arena->large).head.qlh_first = peVar4;
      }
      if (peVar4 == edata) {
        (arena->large).head.qlh_first = (edata_t *)0x0;
      }
      else {
        (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
             (((edata->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
        peVar4 = (edata->field_5).ql_link_active.qre_prev;
        (((edata->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev = peVar4;
        (edata->field_5).ql_link_active.qre_prev = (peVar4->field_5).ql_link_active.qre_next;
        peVar4 = (edata->field_5).ql_link_active.qre_next;
        (((peVar4->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar4;
        (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = edata;
      }
      (arena->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
    }
  }
  else if (duckdb_je_manual_arena_base <= arena->ind) {
    peVar4 = (arena->large).head.qlh_first;
    if (peVar4 == edata) {
      peVar4 = (peVar4->field_5).ql_link_active.qre_next;
      (arena->large).head.qlh_first = peVar4;
    }
    if (peVar4 == edata) {
      (arena->large).head.qlh_first = (edata_t *)0x0;
    }
    else {
      (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
           (((edata->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
      peVar4 = (edata->field_5).ql_link_active.qre_prev;
      (((edata->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev = peVar4;
      (edata->field_5).ql_link_active.qre_prev = (peVar4->field_5).ql_link_active.qre_next;
      peVar4 = (edata->field_5).ql_link_active.qre_next;
      (((peVar4->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar4;
      (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = edata;
    }
  }
  duckdb_je_arena_extent_dalloc_large_prep(tsdn,arena,edata);
  return;
}

Assistant:

static void
large_dalloc_prep_impl(tsdn_t *tsdn, arena_t *arena, edata_t *edata,
    bool locked) {
	if (!locked) {
		/* See comments in arena_bin_slabs_full_insert(). */
		if (!arena_is_auto(arena)) {
			malloc_mutex_lock(tsdn, &arena->large_mtx);
			edata_list_active_remove(&arena->large, edata);
			malloc_mutex_unlock(tsdn, &arena->large_mtx);
		}
	} else {
		/* Only hold the large_mtx if necessary. */
		if (!arena_is_auto(arena)) {
			malloc_mutex_assert_owner(tsdn, &arena->large_mtx);
			edata_list_active_remove(&arena->large, edata);
		}
	}
	arena_extent_dalloc_large_prep(tsdn, arena, edata);
}